

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  long lVar8;
  long lVar9;
  string *this_00;
  _Alloc_hider _Var10;
  size_type sVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pattern;
  smatch m;
  undefined4 local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data *local_58;
  string *local_50;
  MultipartFormData *local_48;
  _Any_data *local_40;
  string *local_38;
  
  local_58 = (_Any_data *)content_callback;
  local_40 = (_Any_data *)header_callback;
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::re_content_disposition_abi_cxx11_,
               "^Content-Disposition:\\s*form-data;\\s*name=\"(.*?)\"(?:;\\s*filename=\"(.*?)\")?(?:;\\s*filename\\*=\\S+)?\\s*$"
               ,1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::dash__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::dash__abi_cxx11_), iVar3 != 0)) {
    parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
    ::dash__abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::dash__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::dash__abi_cxx11_,"--","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::dash__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::dash__abi_cxx11_);
  }
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::crlf__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::crlf__abi_cxx11_), iVar3 != 0)) {
    parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
    ::crlf__abi_cxx11_._M_dataplus._M_p =
         (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::crlf__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_,"\r\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::crlf__abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::crlf__abi_cxx11_);
  }
  buf_append(this,buf,n);
  sVar4 = this->buf_spos_;
  uVar6 = this->buf_epos_ - sVar4;
  if (uVar6 == 0) {
LAB_00146d6f:
    local_bc._0_1_ = 1;
LAB_00146d75:
    return (bool)((byte)local_bc & 1);
  }
  psVar1 = &this->buf_;
  local_48 = &this->file_;
  local_38 = (string *)&(this->file_).filename;
  this_00 = (string *)&(this->file_).content_type;
  local_bc = SUB84(local_38,0);
  local_50 = this_00;
LAB_001464cd:
  switch(this->state_) {
  case 0:
    std::operator+(&local_78,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::dash__abi_cxx11_,&this->boundary_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,
                                (ulong)parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                       ::crlf__abi_cxx11_._M_dataplus._M_p);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    sVar4 = this->buf_spos_;
    bVar2 = true;
    if ((char *)(this->buf_epos_ - sVar4) < local_b8._M_string_length) {
      local_bc = 1;
    }
    else {
      if ((char *)local_b8._M_string_length != (char *)0x0) {
        pcVar12 = (char *)0x0;
        do {
          if (pcVar12[(long)((psVar1->_M_dataplus)._M_p + sVar4)] !=
              local_b8._M_dataplus._M_p[(long)pcVar12]) {
            local_bc = 0;
            goto LAB_00146cce;
          }
          pcVar12 = pcVar12 + 1;
        } while ((char *)local_b8._M_string_length != pcVar12);
      }
      this->buf_spos_ = (size_t)(local_b8._M_string_length + sVar4);
      this->state_ = 1;
      bVar2 = false;
    }
LAB_00146cce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) break;
    goto LAB_00146d75;
  case 1:
    (this->file_).name._M_string_length = 0;
    *(this->file_).name._M_dataplus._M_p = '\0';
    (this->file_).filename._M_string_length = 0;
    *(this->file_).filename._M_dataplus._M_p = '\0';
    (this->file_).content_type._M_string_length = 0;
    *(this->file_).content_type._M_dataplus._M_p = '\0';
    sVar4 = 2;
    goto LAB_00146c62;
  case 2:
    sVar4 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                           ::crlf__abi_cxx11_);
    if (0x2000 < sVar4) goto LAB_00146d92;
    while (sVar4 < this->buf_epos_ - this->buf_spos_) {
      if (sVar4 == 0) {
        if (*(long *)(local_40 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        bVar2 = (**(code **)(local_40->_M_pod_data + 0x18))(local_40,local_48);
        if (!bVar2) goto switchD_001464e9_caseD_5;
        this->buf_spos_ =
             this->buf_spos_ +
             parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::crlf__abi_cxx11_._M_string_length;
        sVar4 = 3;
        goto LAB_00146c62;
      }
      if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
           ::header_name_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                       ::header_name_abi_cxx11_), iVar3 != 0)) {
        parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
        ::header_name_abi_cxx11_._M_dataplus._M_p =
             (pointer)&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                       ::header_name_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::header_name_abi_cxx11_,"content-type:","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::header_name_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::header_name_abi_cxx11_);
        this_00 = local_50;
      }
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)psVar1);
      bVar2 = start_with_case_ignore
                        (this,&local_b8,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::header_name_abi_cxx11_);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
        lVar9 = 0;
        lVar8 = local_90;
        if (local_90 < 1) goto joined_r0x001466e0;
        do {
          if ((local_98[lVar9] != ' ') && (local_98[lVar9] != '\t')) goto joined_r0x001466e0;
          lVar9 = lVar9 + 1;
        } while (local_90 != lVar9);
        do {
          if ((local_98[lVar8 + -1] != ' ') && (local_98[lVar8 + -1] != '\t')) break;
          lVar8 = lVar8 + -1;
joined_r0x001466e0:
        } while (lVar8 != 0);
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
        std::__cxx11::string::operator=(this_00,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          uVar6 = CONCAT71(uStack_87,local_88) + 1;
          _Var10._M_p = local_98;
LAB_0014687d:
          operator_delete(_Var10._M_p,uVar6);
        }
      }
      else {
        local_78.field_2._M_allocated_capacity = 0;
        local_78.field_2._8_8_ = 0;
        local_78._M_dataplus._M_p = (char *)0x0;
        local_78._M_string_length = 0;
        bVar2 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_b8._M_dataplus._M_p,
                           (char *)(local_b8._M_string_length + (long)local_b8._M_dataplus._M_p),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&local_78,
                           &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                            ::re_content_disposition_abi_cxx11_,0);
        if (bVar2) {
          lVar8 = local_78._M_string_length - (long)local_78._M_dataplus._M_p;
          if ((lVar8 == 0) || (0xfffffffffffffffd < (lVar8 >> 3) * -0x5555555555555555 - 5U)) {
            pcVar12 = local_78._M_dataplus._M_p + lVar8 + -0x48;
          }
          else {
            pcVar12 = local_78._M_dataplus._M_p + 0x18;
          }
          local_98 = &local_88;
          if (pcVar12[0x10] == '\x01') {
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_98,*(undefined8 *)pcVar12,*(undefined8 *)(pcVar12 + 8));
          }
          else {
            local_90 = 0;
            local_88 = '\0';
          }
          std::__cxx11::string::operator=((string *)local_48,(string *)&local_98);
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
          }
          lVar8 = local_78._M_string_length - (long)local_78._M_dataplus._M_p;
          if ((lVar8 == 0) || (0xfffffffffffffffc < (lVar8 >> 3) * -0x5555555555555555 - 6U)) {
            pcVar12 = local_78._M_dataplus._M_p + lVar8 + -0x48;
          }
          else {
            pcVar12 = local_78._M_dataplus._M_p + 0x30;
          }
          local_98 = &local_88;
          if (pcVar12[0x10] == '\x01') {
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_98,*(undefined8 *)pcVar12,*(undefined8 *)(pcVar12 + 8));
          }
          else {
            local_90 = 0;
            local_88 = '\0';
          }
          std::__cxx11::string::operator=(local_38,(string *)&local_98);
          this_00 = local_50;
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
            this_00 = local_50;
          }
        }
        if (local_78._M_dataplus._M_p != (char *)0x0) {
          uVar6 = local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p;
          _Var10._M_p = local_78._M_dataplus._M_p;
          goto LAB_0014687d;
        }
      }
      this->buf_spos_ =
           this->buf_spos_ +
           sVar4 + parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                   ::crlf__abi_cxx11_._M_string_length;
      sVar4 = buf_find(this,&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                             ::crlf__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->state_ != 3) goto LAB_00146d6f;
    break;
  case 3:
    std::operator+(&local_b8,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::crlf__abi_cxx11_,
                   &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                    ::dash__abi_cxx11_);
    if ((char *)(this->buf_epos_ - this->buf_spos_) < local_b8._M_string_length) {
      local_bc = 1;
      bVar2 = false;
    }
    else {
      pcVar12 = (char *)buf_find(this,&local_b8);
      local_78._M_dataplus._M_p = (this->buf_)._M_dataplus._M_p + this->buf_spos_;
      local_98 = pcVar12;
      if (*(long *)(local_58 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (**(code **)(local_58->_M_pod_data + 0x18))
                        (local_58,(char **)&local_78,(unsigned_long *)&local_98);
      if (bVar2) {
        this->buf_spos_ = (size_t)(pcVar12 + this->buf_spos_);
        bVar2 = true;
      }
      else {
        this->is_valid_ = false;
        bVar2 = false;
        local_bc = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      std::operator+(&local_78,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::crlf__abi_cxx11_,
                     &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                      ::dash__abi_cxx11_);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,(ulong)(this->boundary_)._M_dataplus._M_p);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((char *)(this->buf_epos_ - this->buf_spos_) < local_b8._M_string_length) {
        local_bc = 1;
        bVar2 = false;
      }
      else {
        pcVar12 = (char *)buf_find(this,&local_b8);
        local_78._M_dataplus._M_p = (this->buf_)._M_dataplus._M_p + this->buf_spos_;
        if (pcVar12 < (char *)(this->buf_epos_ - this->buf_spos_)) {
          local_98 = pcVar12;
          if (*(long *)(local_58 + 1) == 0) {
LAB_00146ec6:
            std::__throw_bad_function_call();
          }
          bVar2 = (**(code **)(local_58->_M_pod_data + 0x18))
                            (local_58,(char **)&local_78,(unsigned_long *)&local_98);
          if (!bVar2) {
LAB_00146caa:
            this->is_valid_ = false;
            bVar2 = false;
            local_bc = 0;
            goto LAB_00146d41;
          }
          this->buf_spos_ = (size_t)(pcVar12 + local_b8._M_string_length + this->buf_spos_);
          this->state_ = 4;
        }
        else {
          local_98 = (char *)local_b8._M_string_length;
          if (*(long *)(local_58 + 1) == 0) goto LAB_00146ec6;
          bVar2 = (**(code **)(local_58->_M_pod_data + 0x18))
                            (local_58,(char **)&local_78,(unsigned_long *)&local_98);
          if (!bVar2) goto LAB_00146caa;
          this->buf_spos_ = (size_t)(local_b8._M_string_length + this->buf_spos_);
        }
        bVar2 = true;
      }
      goto LAB_00146d41;
    }
    goto LAB_00146d75;
  case 4:
    if (uVar6 < parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                ::crlf__abi_cxx11_._M_string_length) goto LAB_00146d6f;
    if (parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
        ::crlf__abi_cxx11_._M_string_length != 0) {
      sVar11 = 0;
      do {
        if ((psVar1->_M_dataplus)._M_p[sVar11 + sVar4] !=
            parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
            ::crlf__abi_cxx11_._M_dataplus._M_p[sVar11]) {
          std::operator+(&local_b8,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::dash__abi_cxx11_,
                         &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                          ::crlf__abi_cxx11_);
          sVar4 = this->buf_spos_;
          if ((char *)(this->buf_epos_ - sVar4) < local_b8._M_string_length) goto LAB_00146aca;
          if ((char *)local_b8._M_string_length == (char *)0x0) goto LAB_00146d1d;
          pcVar12 = (char *)0x0;
          goto LAB_00146d07;
        }
        sVar11 = sVar11 + 1;
      } while (parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
               ::crlf__abi_cxx11_._M_string_length != sVar11);
    }
    this->buf_spos_ =
         parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
         ::crlf__abi_cxx11_._M_string_length + sVar4;
    sVar4 = 1;
LAB_00146c62:
    this->state_ = sVar4;
    break;
  case 5:
switchD_001464e9_caseD_5:
    this->is_valid_ = false;
LAB_00146d92:
    local_bc._0_1_ = 0;
    goto LAB_00146d75;
  }
  goto switchD_001464e9_default;
  while (pcVar12 = pcVar12 + 1, (char *)local_b8._M_string_length != pcVar12) {
LAB_00146d07:
    if (pcVar12[(long)((psVar1->_M_dataplus)._M_p + sVar4)] !=
        local_b8._M_dataplus._M_p[(long)pcVar12]) goto LAB_00146aca;
  }
LAB_00146d1d:
  this->buf_spos_ = (size_t)(local_b8._M_string_length + sVar4);
  this->is_valid_ = true;
  this->state_ = 5;
  bVar2 = true;
LAB_00146d41:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) goto LAB_00146d75;
switchD_001464e9_default:
  sVar4 = this->buf_spos_;
  uVar6 = this->buf_epos_ - sVar4;
  if (uVar6 == 0) goto LAB_00146d6f;
  goto LAB_001464cd;
LAB_00146aca:
  bVar2 = false;
  local_bc = 1;
  goto LAB_00146d41;
}

Assistant:

bool parse(const char *buf, size_t n, const ContentReceiver &content_callback,
             const MultipartContentHeader &header_callback) {

    // TODO: support 'filename*'
    static const std::regex re_content_disposition(
        R"~(^Content-Disposition:\s*form-data;\s*name="(.*?)"(?:;\s*filename="(.*?)")?(?:;\s*filename\*=\S+)?\s*$)~",
        std::regex_constants::icase);

    static const std::string dash_ = "--";
    static const std::string crlf_ = "\r\n";

    buf_append(buf, n);

    while (buf_size() > 0) {
      switch (state_) {
      case 0: { // Initial boundary
        auto pattern = dash_ + boundary_ + crlf_;
        if (pattern.size() > buf_size()) { return true; }
        if (!buf_start_with(pattern)) { return false; }
        buf_erase(pattern.size());
        state_ = 1;
        break;
      }
      case 1: { // New entry
        clear_file_info();
        state_ = 2;
        break;
      }
      case 2: { // Headers
        auto pos = buf_find(crlf_);
        if (pos > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }
        while (pos < buf_size()) {
          // Empty line
          if (pos == 0) {
            if (!header_callback(file_)) {
              is_valid_ = false;
              return false;
            }
            buf_erase(crlf_.size());
            state_ = 3;
            break;
          }

          static const std::string header_name = "content-type:";
          const auto header = buf_head(pos);
          if (start_with_case_ignore(header, header_name)) {
            file_.content_type = trim_copy(header.substr(header_name.size()));
          } else {
            std::smatch m;
            if (std::regex_match(header, m, re_content_disposition)) {
              file_.name = m[1];
              file_.filename = m[2];
            }
          }

          buf_erase(pos + crlf_.size());
          pos = buf_find(crlf_);
        }
        if (state_ != 3) { return true; }
        break;
      }
      case 3: { // Body
        {
          auto pattern = crlf_ + dash_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);

          if (!content_callback(buf_data(), pos)) {
            is_valid_ = false;
            return false;
          }

          buf_erase(pos);
        }
        {
          auto pattern = crlf_ + dash_ + boundary_;
          if (pattern.size() > buf_size()) { return true; }

          auto pos = buf_find(pattern);
          if (pos < buf_size()) {
            if (!content_callback(buf_data(), pos)) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pos + pattern.size());
            state_ = 4;
          } else {
            if (!content_callback(buf_data(), pattern.size())) {
              is_valid_ = false;
              return false;
            }

            buf_erase(pattern.size());
          }
        }
        break;
      }
      case 4: { // Boundary
        if (crlf_.size() > buf_size()) { return true; }
        if (buf_start_with(crlf_)) {
          buf_erase(crlf_.size());
          state_ = 1;
        } else {
          auto pattern = dash_ + crlf_;
          if (pattern.size() > buf_size()) { return true; }
          if (buf_start_with(pattern)) {
            buf_erase(pattern.size());
            is_valid_ = true;
            state_ = 5;
          } else {
            return true;
          }
        }
        break;
      }
      case 5: { // Done
        is_valid_ = false;
        return false;
      }
      }
    }

    return true;
  }